

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

cio_error cio_websocket_init(cio_websocket *websocket,_Bool is_server,
                            cio_websocket_on_connect_t on_connect,
                            cio_websocket_close_hook_t close_hook)

{
  cio_error cVar1;
  
  if ((websocket != (cio_websocket *)0x0) && (on_connect != (cio_websocket_on_connect_t)0x0)) {
    websocket->on_connect = on_connect;
    (websocket->ws_private).read_handler = (cio_websocket_read_handler_t)0x0;
    websocket->on_error = (_func_void_cio_websocket_ptr_cio_error_char_ptr *)0x0;
    websocket->on_control =
         (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0;
    (websocket->ws_private).close_hook = close_hook;
    *(ushort *)&(websocket->ws_private).ws_flags =
         (ushort)is_server << 10 | SUB42((websocket->ws_private).ws_flags,0) & 0xe01f | 0x800;
    (websocket->ws_private).remaining_read_frame_length = 0;
    (websocket->ws_private).write_message_job.wbh = (cio_write_buffer *)0x0;
    (websocket->ws_private).write_ping_job.wbh = (cio_write_buffer *)0x0;
    (websocket->ws_private).write_ping_job.is_continuation_chunk = false;
    (websocket->ws_private).write_pong_job.wbh = (cio_write_buffer *)0x0;
    (websocket->ws_private).write_pong_job.is_continuation_chunk = false;
    (websocket->ws_private).write_close_job.wbh = (cio_write_buffer *)0x0;
    (websocket->ws_private).write_close_job.is_continuation_chunk = false;
    (websocket->ws_private).first_write_job = (cio_websocket_write_job *)0x0;
    cio_utf8_init(&(websocket->ws_private).utf8_state);
    cVar1 = cio_random_seed_rng(&(websocket->ws_private).rng);
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

static enum cio_error cio_websocket_init(struct cio_websocket *websocket, bool is_server, cio_websocket_on_connect_t on_connect, cio_websocket_close_hook_t close_hook)
{
	if (cio_unlikely((websocket == NULL) || (on_connect == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	websocket->on_connect = on_connect;
	websocket->on_control = NULL;
	websocket->ws_private.read_handler = NULL;

	websocket->on_error = NULL;
	websocket->ws_private.close_hook = close_hook;
	websocket->ws_private.ws_flags.is_server = is_server ? 1 : 0;
	websocket->ws_private.ws_flags.frag_opcode = 0;
	websocket->ws_private.ws_flags.self_initiated_close = 0;
	websocket->ws_private.ws_flags.fragmented_write = 1;
	websocket->ws_private.ws_flags.closed_by_error = 0;
	websocket->ws_private.remaining_read_frame_length = 0;

	websocket->ws_private.write_message_job.wbh = NULL;
	websocket->ws_private.write_ping_job.wbh = NULL;
	websocket->ws_private.write_ping_job.is_continuation_chunk = false;
	websocket->ws_private.write_pong_job.wbh = NULL;
	websocket->ws_private.write_pong_job.is_continuation_chunk = false;
	websocket->ws_private.write_close_job.wbh = NULL;
	websocket->ws_private.write_close_job.is_continuation_chunk = false;

	websocket->ws_private.first_write_job = NULL;

	cio_utf8_init(&websocket->ws_private.utf8_state);

	return cio_random_seed_rng(&websocket->ws_private.rng);
}